

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O2

void __thiscall CCharacterCore::Write(CCharacterCore *this,CNetObj_CharacterCore *pObjCore)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float fVar7;
  
  fVar7 = (this->m_Pos).field_0.x;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_X = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_Pos).field_1.y;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_Y = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_Vel).field_0.x * 256.0;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_VelX = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_Vel).field_1.y * 256.0;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_VelY = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  uVar1 = this->m_HookTick;
  uVar2 = this->m_HookState;
  pObjCore->m_HookState = uVar2;
  pObjCore->m_HookTick = uVar1;
  fVar7 = (this->m_HookPos).field_0.x;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_HookX = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_HookPos).field_1.y;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_HookY = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_HookDir).field_0.x * 256.0;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_HookDx = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  fVar7 = (this->m_HookDir).field_1.y * 256.0;
  uVar6 = -(uint)(0.0 < fVar7);
  pObjCore->m_HookDy = (int)((float)(~uVar6 & 0xbf000000 | uVar6 & 0x3f000000) + fVar7);
  iVar3 = this->m_HookedPlayer;
  iVar4 = this->m_Jumped;
  iVar5 = this->m_Direction;
  pObjCore->m_Angle = this->m_Angle;
  pObjCore->m_Direction = iVar5;
  pObjCore->m_Jumped = iVar4;
  pObjCore->m_HookedPlayer = iVar3;
  return;
}

Assistant:

void CCharacterCore::Write(CNetObj_CharacterCore *pObjCore) const
{
	pObjCore->m_X = round_to_int(m_Pos.x);
	pObjCore->m_Y = round_to_int(m_Pos.y);

	pObjCore->m_VelX = round_to_int(m_Vel.x*256.0f);
	pObjCore->m_VelY = round_to_int(m_Vel.y*256.0f);
	pObjCore->m_HookState = m_HookState;
	pObjCore->m_HookTick = m_HookTick;
	pObjCore->m_HookX = round_to_int(m_HookPos.x);
	pObjCore->m_HookY = round_to_int(m_HookPos.y);
	pObjCore->m_HookDx = round_to_int(m_HookDir.x*256.0f);
	pObjCore->m_HookDy = round_to_int(m_HookDir.y*256.0f);
	pObjCore->m_HookedPlayer = m_HookedPlayer;
	pObjCore->m_Jumped = m_Jumped;
	pObjCore->m_Direction = m_Direction;
	pObjCore->m_Angle = m_Angle;
}